

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O2

int xmlCatalogSetDebug(int level)

{
  int iVar1;
  
  iVar1 = xmlDebugCatalogs;
  xmlDebugCatalogs = 0;
  if (0 < level) {
    xmlDebugCatalogs = level;
  }
  return iVar1;
}

Assistant:

int
xmlCatalogSetDebug(int level) {
    int ret = xmlDebugCatalogs;

    if (level <= 0)
        xmlDebugCatalogs = 0;
    else
	xmlDebugCatalogs = level;
    return(ret);
}